

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLNode * __thiscall tinyxml2::XMLNode::InsertFirstChild(XMLNode *this,XMLNode *addThis)

{
  XMLNode *addThis_local;
  XMLNode *this_local;
  
  if (addThis->_document == this->_document) {
    InsertChildPreamble(this,addThis);
    if (this->_firstChild == (XMLNode *)0x0) {
      this->_lastChild = addThis;
      this->_firstChild = addThis;
      addThis->_prev = (XMLNode *)0x0;
      addThis->_next = (XMLNode *)0x0;
    }
    else {
      this->_firstChild->_prev = addThis;
      addThis->_next = this->_firstChild;
      this->_firstChild = addThis;
      addThis->_prev = (XMLNode *)0x0;
    }
    addThis->_parent = this;
    this_local = addThis;
  }
  else {
    this_local = (XMLNode *)0x0;
  }
  return this_local;
}

Assistant:

XMLNode* XMLNode::InsertFirstChild( XMLNode* addThis )
{
    TIXMLASSERT( addThis );
    if ( addThis->_document != _document ) {
        TIXMLASSERT( false );
        return 0;
    }
    InsertChildPreamble( addThis );

    if ( _firstChild ) {
        TIXMLASSERT( _lastChild );
        TIXMLASSERT( _firstChild->_prev == 0 );

        _firstChild->_prev = addThis;
        addThis->_next = _firstChild;
        _firstChild = addThis;

        addThis->_prev = 0;
    }
    else {
        TIXMLASSERT( _lastChild == 0 );
        _firstChild = _lastChild = addThis;

        addThis->_prev = 0;
        addThis->_next = 0;
    }
    addThis->_parent = this;
    return addThis;
}